

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O3

int event_callback_finalize_many_
              (event_base *base,int n_cbs,event_callback **evcbs,
              _func_void_event_callback_ptr_void_ptr *cb)

{
  int iVar1;
  uint flags;
  void *pvVar2;
  event_callback *evcb;
  ulong uVar3;
  
  if (base == (event_base *)0x0) {
    base = event_global_current_base_;
  }
  pvVar2 = base->th_base_lock;
  if (pvVar2 != (void *)0x0) {
    (*evthread_lock_fns_.lock)(0,pvVar2);
  }
  flags = (uint)pvVar2;
  if (event_debug_logging_mask_ != 0) {
    flags = 0x26e164;
    event_debugx_("%s: %d events finalizing","event_callback_finalize_many_",(ulong)(uint)n_cbs);
  }
  if (0 < n_cbs) {
    uVar3 = 0;
    iVar1 = 0;
    do {
      evcb = evcbs[uVar3];
      if (evcb == base->current_event) {
        event_callback_finalize_nolock_(base,(uint)evcb,evcb,cb);
        flags = (uint)evcb;
        iVar1 = iVar1 + 1;
      }
      else {
        event_callback_cancel_nolock_(base,evcb,0);
        flags = (uint)evcb;
      }
      uVar3 = uVar3 + 1;
    } while ((uint)n_cbs != uVar3);
    if (iVar1 != 0) goto LAB_0024ad4a;
  }
  event_callback_finalize_nolock_(base,flags,*evcbs,cb);
LAB_0024ad4a:
  if (base->th_base_lock != (void *)0x0) {
    (*evthread_lock_fns_.unlock)(0,base->th_base_lock);
  }
  return 0;
}

Assistant:

int
event_callback_finalize_many_(struct event_base *base, int n_cbs, struct event_callback **evcbs, void (*cb)(struct event_callback *, void *))
{
	int n_pending = 0, i;

	if (base == NULL)
		base = current_base;

	EVBASE_ACQUIRE_LOCK(base, th_base_lock);

	event_debug(("%s: %d events finalizing", __func__, n_cbs));

	/* At most one can be currently executing; the rest we just
	 * cancel... But we always make sure that the finalize callback
	 * runs. */
	for (i = 0; i < n_cbs; ++i) {
		struct event_callback *evcb = evcbs[i];
		if (evcb == base->current_event) {
			event_callback_finalize_nolock_(base, 0, evcb, cb);
			++n_pending;
		} else {
			event_callback_cancel_nolock_(base, evcb, 0);
		}
	}

	if (n_pending == 0) {
		/* Just do the first one. */
		event_callback_finalize_nolock_(base, 0, evcbs[0], cb);
	}

	EVBASE_RELEASE_LOCK(base, th_base_lock);
	return 0;
}